

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDFastPFor<4U>,_FastPForLib::VariableByte>::
~CompositeCodec(CompositeCodec<FastPForLib::SIMDFastPFor<4U>,_FastPForLib::VariableByte> *this)

{
  pointer puVar1;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bea30;
  (this->codec1).super_IntegerCODEC._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001beaa0;
  puVar1 = (this->codec1).bytescontainer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  std::
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  ::~vector(&(this->codec1).datatobepacked);
  operator_delete(this);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}